

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

void slang::ast::Lookup::name
               (NameSyntax *syntax,ASTContext *context,bitmask<slang::ast::LookupFlags> flags,
               LookupResult *result)

{
  SyntaxKind SVar1;
  Scope *this;
  GenericClassDefSymbol *this_00;
  Compilation *this_01;
  undefined1 auVar2 [16];
  optional<slang::SourceRange> sourceRange;
  optional<slang::SourceRange> range;
  optional<slang::SourceRange> range_00;
  string_view name;
  bool bVar3;
  KnownSystemName knownNameId;
  CompilationUnitSymbol *pCVar4;
  Type *pTVar5;
  SystemSubroutine *pSVar6;
  SourceLocation SVar7;
  Diagnostic *pDVar8;
  ulong uVar9;
  char *pcVar10;
  LookupResult *in_R9;
  LookupResult *result_00;
  SourceRange SVar11;
  string_view sVar12;
  string_view name_00;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors;
  SourceRange range_01;
  LookupLocation location;
  size_t sStackY_110;
  undefined4 uVar13;
  undefined4 uVar14;
  Token nameToken;
  NameComponents local_b8;
  _Storage<slang::SourceRange,_true> local_78;
  undefined1 local_68;
  undefined7 uStack_67;
  _Storage<slang::SourceRange,_true> local_60;
  undefined1 local_50;
  undefined7 uStack_4f;
  SourceLocation local_48;
  SourceLocation SStack_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  this = (context->scope).ptr;
  local_b8.selectors._M_ptr = (pointer)0x0;
  local_b8.selectors._M_extent._M_extent_value = 0;
  local_b8.range.startLoc = (SourceLocation)0x0;
  local_b8.range.endLoc = (SourceLocation)0x0;
  local_b8.paramAssignments = (ParameterValueAssignmentSyntax *)0x0;
  local_b8.text._M_len = 0;
  local_b8.text._M_str = (char *)0x0;
  SVar1 = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
  uVar9 = (ulong)(SVar1 - IdentifierName);
  if (1 < SVar1 - IdentifierName) {
    if (SVar1 == UnitScope) {
      if ((flags.m_bits >> 9 & 1) != 0) {
        pCVar4 = Scope::getCompilationUnit(this);
        goto LAB_002abfdf;
      }
      nameToken = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
      SVar7 = parsing::Token::location(&nameToken);
      sVar12 = parsing::Token::valueText(&nameToken);
      pDVar8 = LookupResult::addDiag
                         (result,this,(DiagCode)0x550005,
                          (SourceLocation)((long)SVar7 + sVar12._M_len * 0x10000000));
      pcVar10 = "::";
      sStackY_110 = 2;
    }
    else {
      if (SVar1 == ConstructorName) {
        SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        pDVar8 = LookupResult::addDiag(result,this,(DiagCode)0x35000a,SVar11);
        nameToken = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
        sVar12 = parsing::Token::valueText(&nameToken);
        Diagnostic::operator<<(pDVar8,sVar12);
LAB_002abc8e:
        result->found = (Symbol *)0x0;
        return;
      }
      if (SVar1 == LocalScope) goto LAB_002abc8e;
      if (SVar1 != RootScope) {
        if (SVar1 == ScopedName) {
          qualified((ScopedNameSyntax *)syntax,context,flags,result);
          local_60._M_value = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          local_50 = 1;
          range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_4f;
          range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
          range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_payload._M_value = local_60._M_value;
          anon_unknown_39::unwrapResult(this,range,result,true);
          if (-1 < (char)flags.m_bits) {
            return;
          }
          LookupResult::errorIfSelectors(result,context);
          return;
        }
        if (SVar1 == SystemName) {
          nameToken = *(Token *)(syntax + 1);
          result->found = (Symbol *)0x0;
          knownNameId = parsing::Token::systemName(&nameToken);
          this_01 = this->compilation;
          if (knownNameId == Unknown) {
            sVar12 = parsing::Token::valueText(&nameToken);
            pSVar6 = Compilation::getSystemSubroutine(this_01,sVar12);
          }
          else {
            pSVar6 = Compilation::getSystemSubroutine(this_01,knownNameId);
          }
          result->systemSubroutine = pSVar6;
          if (pSVar6 != (SystemSubroutine *)0x0) {
            return;
          }
          SVar11 = parsing::Token::range(&nameToken);
          pDVar8 = LookupResult::addDiag(result,this,(DiagCode)0x42000a,SVar11);
          sVar12 = parsing::Token::valueText(&nameToken);
          goto LAB_002abf96;
        }
        if (SVar1 == ThisHandle) {
          SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          range_01.endLoc = (SourceLocation)result;
          range_01.startLoc = SVar11.endLoc;
          pCVar4 = (CompilationUnitSymbol *)
                   anon_unknown_39::findThisHandle
                             ((anon_unknown_39 *)this,(Scope *)(ulong)flags.m_bits,
                              (bitmask<slang::ast::LookupFlags>)SVar11.startLoc._0_4_,range_01,in_R9
                             );
          goto LAB_002abfdf;
        }
        goto LAB_002abb94;
      }
      if ((flags.m_bits >> 8 & 1) != 0) {
        pCVar4 = (CompilationUnitSymbol *)Compilation::getRoot(this->compilation);
        goto LAB_002abfdf;
      }
      nameToken = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
      SVar7 = parsing::Token::location(&nameToken);
      sVar12 = parsing::Token::valueText(&nameToken);
      pDVar8 = LookupResult::addDiag
                         (result,this,(DiagCode)0x550005,
                          (SourceLocation)((long)SVar7 + sVar12._M_len * 0x10000000));
      pcVar10 = ".";
      sStackY_110 = 1;
    }
    sVar12._M_str = pcVar10;
    sVar12._M_len = sStackY_110;
LAB_002abf96:
    Diagnostic::operator<<(pDVar8,sVar12);
    return;
  }
LAB_002abb94:
  anon_unknown_39::NameComponents::NameComponents(&local_b8,syntax);
  if (local_b8.text._M_len == 0) {
    return;
  }
  local_48 = local_b8.range.startLoc;
  SStack_40 = local_b8.range.endLoc;
  local_38 = 1;
  sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_37;
  sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
  uVar13 = local_b8.range.startLoc._0_4_;
  uVar14 = local_b8.range.startLoc._4_4_;
  result_00 = (LookupResult *)(ulong)flags.m_bits;
  sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
       local_b8.range.endLoc;
  sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
       local_b8.range.startLoc;
  name_00._M_str = local_b8.text._M_str;
  name_00._M_len = local_b8.text._M_len;
  location.index = context->lookupIndex;
  location.scope = (Scope *)uVar9;
  location._12_4_ = 0;
  unqualifiedImpl(this,name_00,location,sourceRange,flags,0,result,this,(SyntaxNode *)syntax);
  if (result->found == (Symbol *)0x0) {
    if ((flags.m_bits >> 0xd & 1) != 0) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = &local_b8;
      result_00 = result;
      bVar3 = anon_unknown_39::lookupUpward
                        ((anon_unknown_39 *)0x0,
                         (span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
                          )(auVar2 << 0x40),(NameComponents *)context,
                         (ASTContext *)(ulong)flags.m_bits,
                         (bitmask<slang::ast::LookupFlags>)(underlying_type)result,
                         (LookupResult *)CONCAT44(uVar14,uVar13));
      if (!bVar3) {
        return;
      }
      if (result->found != (Symbol *)0x0) goto LAB_002abc11;
    }
    bVar3 = LookupResult::hasError(result);
    if (!bVar3) {
      name._M_str = local_b8.text._M_str;
      name._M_len = local_b8.text._M_len;
      SVar11.endLoc = local_b8.range.endLoc;
      SVar11.startLoc = local_b8.range.startLoc;
      result_00 = (LookupResult *)(ulong)flags.m_bits;
      reportUndeclared(this,name,SVar11,flags,false,result);
    }
  }
LAB_002abc11:
  this_00 = (GenericClassDefSymbol *)result->found;
  if (local_b8.paramAssignments != (ParameterValueAssignmentSyntax *)0x0 &&
      this_00 != (GenericClassDefSymbol *)0x0) {
    if ((this_00->super_Symbol).kind == GenericClassDef) {
      pTVar5 = GenericClassDefSymbol::getSpecialization(this_00,context,local_b8.paramAssignments);
    }
    else {
      SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pDVar8 = LookupResult::addDiag(result,this,(DiagCode)0x1f000a,SVar11);
      Diagnostic::operator<<(pDVar8,result->found->name);
      Diagnostic::addNote(pDVar8,(DiagCode)0x50001,result->found->location);
      pTVar5 = (Type *)0x0;
    }
    result->found = &pTVar5->super_Symbol;
  }
  local_78._M_value = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  local_68 = 1;
  range_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_67;
  range_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
  range_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value = local_78._M_value;
  anon_unknown_39::unwrapResult(this,range_00,result,true);
  if ((pointer)local_b8.selectors._M_extent._M_extent_value == (pointer)0x0) {
    return;
  }
  if (((result->found == (Symbol *)0x0) || (bVar3 = Symbol::isScope(result->found), !bVar3)) ||
     (bVar3 = Symbol::isType(result->found), bVar3)) {
    SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
    ::
    append_range<std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
              (&(result->selectors).
                super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
               ,&local_b8.selectors);
    if (-1 < (char)flags.m_bits) {
      return;
    }
    LookupResult::errorIfSelectors(result,context);
    return;
  }
  selectors._M_extent._M_extent_value = (size_t)context;
  selectors._M_ptr = (pointer)local_b8.selectors._M_extent._M_extent_value;
  pCVar4 = (CompilationUnitSymbol *)
           selectChild((Lookup *)result->found,(Symbol *)local_b8.selectors._M_ptr,selectors,
                       (ASTContext *)result,result_00);
LAB_002abfdf:
  result->found = &pCVar4->super_Symbol;
  return;
}

Assistant:

void Lookup::name(const NameSyntax& syntax, const ASTContext& context, bitmask<LookupFlags> flags,
                  LookupResult& result) {
    auto& scope = *context.scope;
    NameComponents name;
    switch (syntax.kind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            name = syntax;
            break;
        case SyntaxKind::ScopedName:
            // Handle qualified names separately.
            qualified(syntax.as<ScopedNameSyntax>(), context, flags, result);
            unwrapResult(scope, syntax.sourceRange(), result);
            if (flags.has(LookupFlags::NoSelectors))
                result.errorIfSelectors(context);
            return;
        case SyntaxKind::ThisHandle:
            result.found = findThisHandle(scope, flags, syntax.sourceRange(), result);
            return;
        case SyntaxKind::SystemName: {
            // If this is a system name, look up directly in the compilation.
            Token nameToken = syntax.as<SystemNameSyntax>().systemIdentifier;
            result.found = nullptr;

            if (auto knownNameId = nameToken.systemName();
                knownNameId != KnownSystemName::Unknown) {
                result.systemSubroutine = scope.getCompilation().getSystemSubroutine(knownNameId);
            }
            else {
                result.systemSubroutine = scope.getCompilation().getSystemSubroutine(
                    nameToken.valueText());
            }

            if (!result.systemSubroutine) {
                result.addDiag(scope, diag::UnknownSystemName, nameToken.range())
                    << nameToken.valueText();
            }
            return;
        }
        case SyntaxKind::RootScope:
            if (!flags.has(LookupFlags::AllowRoot)) {
                auto tok = syntax.getFirstToken();
                result.addDiag(scope, diag::ExpectedToken,
                               tok.location() + tok.valueText().length())
                    << "."sv;
                return;
            }
            result.found = &scope.getCompilation().getRoot();
            return;
        case SyntaxKind::UnitScope:
            if (!flags.has(LookupFlags::AllowUnit)) {
                auto tok = syntax.getFirstToken();
                result.addDiag(scope, diag::ExpectedToken,
                               tok.location() + tok.valueText().length())
                    << "::"sv;
                return;
            }
            result.found = scope.getCompilationUnit();
            return;
        case SyntaxKind::ConstructorName:
            result.addDiag(scope, diag::UnexpectedNameToken, syntax.sourceRange())
                << syntax.getFirstToken().valueText();
            result.found = nullptr;
            return;
        case SyntaxKind::LocalScope:
            // This can only happen in error scenarios, where the parser has
            // already issued a diagnostic.
            result.found = nullptr;
            return;
        case SyntaxKind::SuperHandle:
        case SyntaxKind::ArrayUniqueMethod:
        case SyntaxKind::ArrayAndMethod:
        case SyntaxKind::ArrayOrMethod:
        case SyntaxKind::ArrayXorMethod:
            // These error cases can't happen here because the parser will always
            // wrap them into a scoped name.
        default:
            SLANG_UNREACHABLE;
    }

    // If the parser added a missing identifier token, it already issued an appropriate error.
    if (name.text.empty())
        return;

    // Perform the lookup.
    unqualifiedImpl(scope, name.text, context.getLocation(), name.range, flags, {}, result, scope,
                    &syntax);

    if (!result.found) {
        if (flags.has(LookupFlags::AlwaysAllowUpward)) {
            if (!lookupUpward({}, name, context, flags, result))
                return;
        }

        if (!result.found && !result.hasError())
            reportUndeclared(scope, name.text, name.range, flags, false, result);
    }

    if (result.found && name.paramAssignments) {
        if (result.found->kind != SymbolKind::GenericClassDef) {
            auto& diag = result.addDiag(scope, diag::NotAGenericClass, syntax.sourceRange());
            diag << result.found->name;
            diag.addNote(diag::NoteDeclarationHere, result.found->location);

            result.found = nullptr;
        }
        else {
            auto& classDef = result.found->as<GenericClassDefSymbol>();
            result.found = &classDef.getSpecialization(context, *name.paramAssignments);
        }
    }

    unwrapResult(scope, syntax.sourceRange(), result);

    if (!name.selectors.empty()) {
        // If this is a scope, the selectors should be an index into it.
        if (result.found && result.found->isScope() && !result.found->isType()) {
            result.found = selectChild(*result.found, name.selectors, context, result);
        }
        else {
            result.selectors.append_range(name.selectors);
            if (flags.has(LookupFlags::NoSelectors))
                result.errorIfSelectors(context);
        }
    }
}